

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

void __thiscall
rudp::session::session
          (session *this,io_service *ios,socket *sock,endpoint *endpoint_,
          function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)> *on_closed_
          )

{
  iterator __first;
  iterator __last;
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> local_50 [2];
  function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)> *local_30;
  function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)> *on_closed__local;
  endpoint *endpoint__local;
  socket *sock_local;
  io_service *ios_local;
  session *this_local;
  
  local_30 = on_closed_;
  on_closed__local =
       (function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)> *)endpoint_;
  endpoint__local = (endpoint *)sock;
  sock_local = (socket *)ios;
  ios_local = (io_service *)this;
  std::enable_shared_from_this<rudp::session>::enable_shared_from_this
            (&this->super_enable_shared_from_this<rudp::session>);
  this->io_service = (io_service *)sock_local;
  this->socket = (socket *)endpoint__local;
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&this->endpoint,(basic_endpoint<boost::asio::ip::udp> *)on_closed__local);
  session_config::session_config(&this->self_config);
  session_config::session_config(&this->remote_config);
  std::array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
  ::array(&this->receive_buffer);
  this->receive_head = '\0';
  std::
  array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
  ::array(&this->send_buffer);
  this->send_head = '\0';
  this->acknowledge_head = '\0';
  std::
  queue<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>>
  ::
  queue<std::deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>,void>
            ((queue<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>>
              *)&this->pending);
  this->cumulative_ack_count = 0;
  std::
  shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::shared_ptr(&this->cumulative_ack_timer);
  std::
  shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::shared_ptr(&this->null_segment_timer);
  std::
  shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::shared_ptr(&this->tcs_timer);
  std::
  array<std::pair<std::shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_unsigned_long>,_256UL>
  ::array(&this->retransmission_timer);
  this->state = initial;
  this->client = false;
  std::function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)>::function
            (&this->on_closed,local_30);
  __first = std::
            array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
            ::begin(&this->receive_buffer);
  __last = std::
           array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
           ::end(&this->receive_buffer);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::shared_ptr
            (local_50);
  std::
  fill<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
            (__first,__last,local_50);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
            (local_50);
  pvVar1 = std::
           array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
           ::begin(&this->send_buffer);
  pvVar2 = std::
           array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
           ::end(&this->send_buffer);
  std::
  for_each<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::session(boost::asio::io_context&,boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)>const&)::__0>
            (pvVar1,pvVar2);
  pvVar3 = std::
           array<std::pair<std::shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_unsigned_long>,_256UL>
           ::begin(&this->retransmission_timer);
  pvVar4 = std::
           array<std::pair<std::shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_unsigned_long>,_256UL>
           ::end(&this->retransmission_timer);
  std::
  for_each<std::pair<std::shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,unsigned_long>*,rudp::session::session(boost::asio::io_context&,boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)>const&)::__1>
            (pvVar3,pvVar4);
  return;
}

Assistant:

session::session(
    boost::asio::io_service &ios,
    boost::asio::ip::udp::socket &sock,
    const boost::asio::ip::udp::endpoint &endpoint_,
    const std::function< void( const boost::asio::ip::udp::endpoint& ) > &on_closed_
  ) : io_service( ios ), socket( sock ), endpoint( endpoint_ ), receive_head( 0 ), send_head( 0 ), acknowledge_head( 0 ), cumulative_ack_count( 0 ), state( session_state::initial ), client( false ), on_closed( on_closed_ ) {
    std::fill( receive_buffer.begin(), receive_buffer.end(), buffer_ptr_t() );
    std::for_each( send_buffer.begin(), send_buffer.end(), []    ( auto &v ) { v.first = buffer_ptr_t(); } );
    std::for_each( retransmission_timer.begin(), retransmission_timer.end(), []( auto &v ) { v.second = 0u; } );
  }